

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

void __thiscall
lodepng::ExtractZlib::inflateHuffmanBlock
          (ExtractZlib *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uchar *in,
          size_t *bp,size_t *pos,size_t inlength,unsigned_long btype)

{
  ulong uVar1;
  ulong uVar2;
  uchar *in_00;
  unsigned_long uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  int local_a4;
  uchar *local_a0;
  ulong *local_98;
  long local_90;
  long local_88;
  long local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_78;
  long local_70;
  size_t local_68;
  unsigned_long local_60;
  size_t *local_58;
  ulong local_50;
  size_t local_48;
  HuffmanTree *local_40;
  HuffmanTree *local_38;
  
  local_a0 = in;
  local_98 = pos;
  local_78 = out;
  if (btype == 2) {
    getTreeInflateDynamic(this,&this->codetree,&this->codetreeD,in,bp,inlength);
    if (this->error != 0) {
      return;
    }
  }
  else if (btype == 1) {
    generateFixedTrees(this,&this->codetree,&this->codetreeD);
  }
  local_38 = &this->codetree;
  local_40 = &this->codetreeD;
  local_88 = 0;
  local_80 = 0;
  while( true ) {
    do {
      while( true ) {
        uVar3 = huffmanDecodeSymbol(this,local_a0,bp,local_38,inlength);
        if (this->error != 0) {
          return;
        }
        local_a4 = (int)uVar3;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)(*(long *)(this->zlibinfo + 8) + -0xa0),
                   &local_a4);
        local_a4 = 0;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)(*(long *)(this->zlibinfo + 8) + -0x88),
                   &local_a4);
        local_a4 = 0;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)(*(long *)(this->zlibinfo + 8) + -0x70),
                   &local_a4);
        local_a4 = 0;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)(*(long *)(this->zlibinfo + 8) + -0x58),
                   &local_a4);
        local_a4 = 0;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)(*(long *)(this->zlibinfo + 8) + -0x40),
                   &local_a4);
        local_a4 = 0;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)(*(long *)(this->zlibinfo + 8) + -0x28),
                   &local_a4);
        in_00 = local_a0;
        if (uVar3 == 0x100) {
          lVar6 = *(long *)(this->zlibinfo + 8);
          *(long *)(lVar6 + -0x10) = local_80;
          *(long *)(lVar6 + -8) = local_88;
          return;
        }
        if (0xff < uVar3) break;
        local_a4 = CONCAT31(local_a4._1_3_,(char)uVar3);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (local_78,(uchar *)&local_a4);
        *local_98 = *local_98 + 1;
        local_80 = local_80 + 1;
      }
    } while (0x11d < uVar3);
    if (inlength <= *bp >> 3) break;
    local_48 = *(size_t *)
                (
                "color conversion to palette requested while a color isn\'t in palette, or index out of bounds"
                + uVar3 * 8 + 0xb);
    uVar4 = readBitsFromStream(this,bp,local_a0,local_48);
    local_90 = uVar4 + *(long *)("no null termination char found while decoding text chunk" +
                                uVar3 * 8 + 0x2b);
    uVar3 = huffmanDecodeSymbol(this,in_00,bp,local_40,inlength);
    if (this->error != 0) {
      return;
    }
    if (0x1d < uVar3) {
      this->error = 0x12;
      return;
    }
    if (inlength <= *bp >> 3) break;
    local_68 = *(size_t *)(DISTEXTRA + uVar3 * 8);
    local_58 = bp;
    local_50 = inlength;
    uVar4 = readBitsFromStream(this,bp,local_a0,local_68);
    local_70 = uVar4 + *(long *)(DISTBASE + uVar3 * 8);
    uVar2 = *local_98;
    uVar7 = uVar2 - local_70;
    uVar5 = uVar7;
    lVar6 = local_90;
    local_60 = uVar3;
    while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
      uVar1 = uVar5 + 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (local_78,(local_78->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start + uVar5);
      *local_98 = *local_98 + 1;
      uVar5 = uVar1;
      if (uVar2 <= uVar1) {
        uVar5 = uVar7;
      }
    }
    local_88 = local_88 + 1;
    lVar6 = *(long *)(this->zlibinfo + 8);
    *(int *)(*(long *)(lVar6 + -0x80) + -4) = (int)local_60;
    *(int *)(*(long *)(lVar6 + -0x68) + -4) = (int)local_48;
    *(int *)(*(long *)(lVar6 + -0x50) + -4) = (int)local_68;
    *(int *)(*(long *)(lVar6 + -0x38) + -4) = (int)local_90;
    *(int *)(*(long *)(lVar6 + -0x20) + -4) = (int)local_70;
    bp = local_58;
    inlength = local_50;
  }
  this->error = 0x33;
  return;
}

Assistant:

void inflateHuffmanBlock(std::vector<unsigned char>& out,
                           const unsigned char* in, size_t& bp, size_t& pos, size_t inlength, unsigned long btype) {
    size_t numcodes = 0, numlit = 0, numlen = 0; //for logging
    if(btype == 1) { generateFixedTrees(codetree, codetreeD); }
    else if(btype == 2) { getTreeInflateDynamic(codetree, codetreeD, in, bp, inlength); if(error) return; }
    for(;;) {
      unsigned long code = huffmanDecodeSymbol(in, bp, codetree, inlength); if(error) return;
      numcodes++;
      zlibinfo->back().lz77_lcode.push_back(code); //output code
      zlibinfo->back().lz77_dcode.push_back(0);
      zlibinfo->back().lz77_lbits.push_back(0);
      zlibinfo->back().lz77_dbits.push_back(0);
      zlibinfo->back().lz77_lvalue.push_back(0);
      zlibinfo->back().lz77_dvalue.push_back(0);

      if(code == 256) {
        break; //end code
      } else if(code <= 255) { //literal symbol
        out.push_back((unsigned char)(code));
        pos++;
        numlit++;
      } else if(code >= 257 && code <= 285) { //length code
        size_t length = LENBASE[code - 257], numextrabits = LENEXTRA[code - 257];
        if((bp >> 3) >= inlength) { error = 51; return; } //error, bit pointer will jump past memory
        length += readBitsFromStream(bp, in, numextrabits);
        unsigned long codeD = huffmanDecodeSymbol(in, bp, codetreeD, inlength); if(error) return;
        if(codeD > 29) { error = 18; return; } //error: invalid dist code (30-31 are never used)
        unsigned long dist = DISTBASE[codeD], numextrabitsD = DISTEXTRA[codeD];
        if((bp >> 3) >= inlength) { error = 51; return; } //error, bit pointer will jump past memory
        dist += readBitsFromStream(bp, in, numextrabitsD);
        size_t start = pos, back = start - dist; //backwards
        for(size_t i = 0; i < length; i++) {
          out.push_back(out[back++]);
          pos++;
          if(back >= start) back = start - dist;
        }
        numlen++;
        zlibinfo->back().lz77_dcode.back() = codeD; //output distance code
        zlibinfo->back().lz77_lbits.back() = numextrabits; //output length extra bits
        zlibinfo->back().lz77_dbits.back() = numextrabitsD; //output dist extra bits
        zlibinfo->back().lz77_lvalue.back() = length; //output length
        zlibinfo->back().lz77_dvalue.back() = dist; //output dist
      }
    }
    zlibinfo->back().numlit = numlit; //output number of literal symbols
    zlibinfo->back().numlen = numlen; //output number of length symbols
  }